

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrusive-list.h
# Opt level: O1

ssize_t __thiscall
wabt::intrusive_list<(anonymous_namespace)::TestObject>::splice
          (intrusive_list<(anonymous_namespace)::TestObject> *this,int __fdin,__off64_t *__offin,
          int __fdout,__off64_t *__offout,size_t __len,uint __flags)

{
  long lVar1;
  TestObject *pTVar2;
  TestObject *pTVar3;
  __off64_t *p_Var4;
  intrusive_list<(anonymous_namespace)::TestObject> *extraout_RAX;
  undefined4 in_register_0000000c;
  TestObject *pTVar6;
  TestObject *pTVar7;
  pointer *__ptr;
  undefined4 in_register_00000034;
  iterator iVar8;
  undefined4 in_stack_0000000c;
  TestObject *in_stack_00000010;
  _Head_base<0UL,_(anonymous_namespace)::TestObject_*,_false> local_48;
  intrusive_list<(anonymous_namespace)::TestObject> *local_40;
  TestObject *local_38;
  intrusive_list<(anonymous_namespace)::TestObject> *piVar5;
  
  local_40 = (intrusive_list<(anonymous_namespace)::TestObject> *)
             CONCAT44(in_register_00000034,__fdin);
  pTVar6 = (TestObject *)CONCAT44(in_register_0000000c,__fdout);
  p_Var4 = (__off64_t *)CONCAT44(in_stack_0000000c,__flags);
  local_38 = (TestObject *)__offin;
  if (p_Var4 == __offout) {
    piVar5 = (intrusive_list<(anonymous_namespace)::TestObject> *)&__flags;
    do {
      if ((TestObject *)__len == in_stack_00000010) {
        return (ssize_t)piVar5;
      }
      if ((TestObject *)__len == (TestObject *)0x0) {
        __assert_fail("node_",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/intrusive-list.h"
                      ,0xa5,
                      "iterator &wabt::intrusive_list<(anonymous namespace)::TestObject>::iterator::operator++() [T = (anonymous namespace)::TestObject]"
                     );
      }
      lVar1 = *(long *)&pTVar6->data;
      if (lVar1 == 0) {
        __assert_fail("!empty()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/intrusive-list.h"
                      ,0x223,
                      "std::unique_ptr<T> wabt::intrusive_list<(anonymous namespace)::TestObject>::extract(iterator) [T = (anonymous namespace)::TestObject]"
                     );
      }
      if ((TestObject *)__offout != pTVar6) break;
      pTVar2 = (((TestObject *)__len)->super_intrusive_list_base<(anonymous_namespace)::TestObject>)
               .next_;
      if ((pTVar6->super_intrusive_list_base<(anonymous_namespace)::TestObject>).next_ ==
          (pTVar6->super_intrusive_list_base<(anonymous_namespace)::TestObject>).prev_) {
        (pTVar6->super_intrusive_list_base<(anonymous_namespace)::TestObject>).next_ =
             (TestObject *)0x0;
        (pTVar6->super_intrusive_list_base<(anonymous_namespace)::TestObject>).prev_ =
             (TestObject *)0x0;
      }
      else {
        pTVar3 = (((TestObject *)__len)->
                 super_intrusive_list_base<(anonymous_namespace)::TestObject>).prev_;
        pTVar7 = pTVar3;
        if (pTVar3 == (TestObject *)0x0) {
          pTVar7 = pTVar6;
        }
        (pTVar7->super_intrusive_list_base<(anonymous_namespace)::TestObject>).next_ = pTVar2;
        pTVar7 = (((TestObject *)__len)->
                 super_intrusive_list_base<(anonymous_namespace)::TestObject>).next_;
        if (pTVar7 == (TestObject *)0x0) {
          (pTVar6->super_intrusive_list_base<(anonymous_namespace)::TestObject>).prev_ = pTVar3;
        }
        else {
          (pTVar7->super_intrusive_list_base<(anonymous_namespace)::TestObject>).prev_ = pTVar3;
        }
      }
      (((TestObject *)__len)->super_intrusive_list_base<(anonymous_namespace)::TestObject>).next_ =
           (TestObject *)0x0;
      (((TestObject *)__len)->super_intrusive_list_base<(anonymous_namespace)::TestObject>).prev_ =
           (TestObject *)0x0;
      *(long *)&pTVar6->data = lVar1 + -1;
      iVar8.node_ = local_38;
      iVar8.list_ = local_40;
      local_48._M_head_impl = (TestObject *)__len;
      iVar8 = insert(this,iVar8,
                     (unique_ptr<(anonymous_namespace)::TestObject,_std::default_delete<(anonymous_namespace)::TestObject>_>
                      *)&local_48);
      piVar5 = iVar8.list_;
      if (local_48._M_head_impl != (TestObject *)0x0) {
        if ((local_48._M_head_impl)->moved == false) {
          ::(anonymous_namespace)::TestObject::creation_count =
               ::(anonymous_namespace)::TestObject::creation_count + -1;
        }
        operator_delete(local_48._M_head_impl);
        piVar5 = extraout_RAX;
      }
      local_48._M_head_impl = (TestObject *)0x0;
      __len = (size_t)pTVar2;
    } while (p_Var4 == __offout);
  }
  __assert_fail("list_ == rhs.list_",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/intrusive-list.h"
                ,0xc1,
                "bool wabt::intrusive_list<(anonymous namespace)::TestObject>::iterator::operator!=(iterator) const [T = (anonymous namespace)::TestObject]"
               );
}

Assistant:

inline void intrusive_list<T>::splice(iterator pos,
                                      intrusive_list& other,
                                      iterator first,
                                      iterator last) {
  while (first != last)
    insert(pos, other.extract(first++));
}